

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O0

int __thiscall deqp::egl::CreateSurfaceTests::init(CreateSurfaceTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppNVar1;
  EglTestContext *pEVar2;
  bool bVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *node;
  CreateWindowSurfaceCase *pCVar5;
  CreatePixmapSurfaceCase *pCVar6;
  pointer pNVar7;
  char *pcVar8;
  char *pcVar9;
  reference pNVar10;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_1a8;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_1a0;
  iterator i_4;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_4;
  FilterList baseFilters_4;
  TestCaseGroup *pixmapGroup_1;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_158;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_150;
  iterator i_3;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_3;
  FilterList baseFilters_3;
  TestCaseGroup *windowGroup_1;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_108;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_100;
  iterator i_2;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_2;
  FilterList baseFilters_2;
  TestCaseGroup *pbufferGroup;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_b8;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_b0;
  iterator i_1;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_1;
  FilterList baseFilters_1;
  TestCaseGroup *pixmapGroup;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_68;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_60;
  iterator i;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  TestCaseGroup *windowGroup;
  CreateSurfaceTests *this_local;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"window",
             "Window surfaces");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  ppNVar1 = &filterLists.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<4u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i,
             (FilterList *)
             &filterLists.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_60._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i);
  while( true ) {
    local_68._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i);
    bVar3 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar3) break;
    pCVar5 = (CreateWindowSurfaceCase *)operator_new(0xc0);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_60);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_60);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_60);
    anon_unknown_5::CreateWindowSurfaceCase::CreateWindowSurfaceCase
              (pCVar5,pEVar2,pcVar8,pcVar9,true,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pCVar5);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_60,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pixmap",
             "Pixmap surfaces");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  ppNVar1 = &filterLists_1.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<2u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
             ,(FilterList *)
              &filterLists_1.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b0._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_1);
  while( true ) {
    local_b8._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_1);
    bVar3 = __gnu_cxx::operator!=(&local_b0,&local_b8);
    if (!bVar3) break;
    pCVar6 = (CreatePixmapSurfaceCase *)operator_new(0xc0);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_b0);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_b0);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_b0);
    anon_unknown_5::CreatePixmapSurfaceCase::CreatePixmapSurfaceCase
              (pCVar6,pEVar2,pcVar8,pcVar9,true,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pCVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_b0,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_1.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pbuffer",
             "Pbuffer surfaces");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  ppNVar1 = &filterLists_2.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<1u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
             ,(FilterList *)
              &filterLists_2.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_100._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_2);
  while( true ) {
    local_108._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_2);
    bVar3 = __gnu_cxx::operator!=(&local_100,&local_108);
    if (!bVar3) break;
    node = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_100);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_100);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_100);
    anon_unknown_5::CreatePbufferSurfaceCase::CreatePbufferSurfaceCase
              ((CreatePbufferSurfaceCase *)node,pEVar2,pcVar8,pcVar9,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar4,node);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_100,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_2.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "platform_window","Window surfaces with platform extension");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  ppNVar1 = &filterLists_3.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<4u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
             ,(FilterList *)
              &filterLists_3.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_150._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_3);
  while( true ) {
    local_158._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_3);
    bVar3 = __gnu_cxx::operator!=(&local_150,&local_158);
    if (!bVar3) break;
    pCVar5 = (CreateWindowSurfaceCase *)operator_new(0xc0);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_150);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_150);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_150);
    anon_unknown_5::CreateWindowSurfaceCase::CreateWindowSurfaceCase
              (pCVar5,pEVar2,pcVar8,pcVar9,false,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pCVar5);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_150,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_3.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "platform_pixmap","Pixmap surfaces with platform extension");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  ppNVar1 = &filterLists_4.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<2u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
             ,(FilterList *)
              &filterLists_4.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1a0._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_4);
  while( true ) {
    local_1a8._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_4);
    bVar3 = __gnu_cxx::operator!=(&local_1a0,&local_1a8);
    if (!bVar3) break;
    pCVar6 = (CreatePixmapSurfaceCase *)operator_new(0xc0);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_1a0);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_1a0);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_1a0);
    anon_unknown_5::CreatePixmapSurfaceCase::CreatePixmapSurfaceCase
              (pCVar6,pEVar2,pcVar8,pcVar9,false,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pCVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_1a0,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_4.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void CreateSurfaceTests::init (void)
{
	// Window surfaces
	{
		tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "window", "Window surfaces");
		addChild(windowGroup);

		eglu::FilterList baseFilters;
		baseFilters << surfaceType<EGL_WINDOW_BIT>;

		vector<NamedFilterList> filterLists;
		getDefaultFilterLists(filterLists, baseFilters);

		for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
			windowGroup->addChild(new CreateWindowSurfaceCase(m_eglTestCtx, i->getName(), i->getDescription(), true, *i));
	}

	// Pixmap surfaces
	{
		tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "pixmap", "Pixmap surfaces");
		addChild(pixmapGroup);

		eglu::FilterList baseFilters;
		baseFilters << surfaceType<EGL_PIXMAP_BIT>;

		vector<NamedFilterList> filterLists;
		getDefaultFilterLists(filterLists, baseFilters);

		for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
			pixmapGroup->addChild(new CreatePixmapSurfaceCase(m_eglTestCtx, i->getName(), i->getDescription(), true, *i));
	}

	// Pbuffer surfaces
	{
		tcu::TestCaseGroup* pbufferGroup = new tcu::TestCaseGroup(m_testCtx, "pbuffer", "Pbuffer surfaces");
		addChild(pbufferGroup);

		eglu::FilterList baseFilters;
		baseFilters << surfaceType<EGL_PBUFFER_BIT>;

		vector<NamedFilterList> filterLists;
		getDefaultFilterLists(filterLists, baseFilters);

		for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
			pbufferGroup->addChild(new CreatePbufferSurfaceCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
	}

	// Window surfaces with new platform extension
	{
		tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "platform_window", "Window surfaces with platform extension");
		addChild(windowGroup);

		eglu::FilterList baseFilters;
		baseFilters << surfaceType<EGL_WINDOW_BIT>;

		vector<NamedFilterList> filterLists;
		getDefaultFilterLists(filterLists, baseFilters);

		for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
			windowGroup->addChild(new CreateWindowSurfaceCase(m_eglTestCtx, i->getName(), i->getDescription(), false, *i));
	}

	// Pixmap surfaces with new platform extension
	{
		tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "platform_pixmap", "Pixmap surfaces with platform extension");
		addChild(pixmapGroup);

		eglu::FilterList baseFilters;
		baseFilters << surfaceType<EGL_PIXMAP_BIT>;

		vector<NamedFilterList> filterLists;
		getDefaultFilterLists(filterLists, baseFilters);

		for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
			pixmapGroup->addChild(new CreatePixmapSurfaceCase(m_eglTestCtx, i->getName(), i->getDescription(), false, *i));
	}
}